

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixClose(sqlite3_file *id)

{
  int iVar1;
  unixFile *pFile;
  int rc;
  sqlite3_file *id_local;
  
  verifyDbFile((unixFile *)id);
  unixUnlock(id,0);
  unixEnterMutex();
  if ((id[2].pMethods != (sqlite3_io_methods *)0x0) && (*(int *)&(id[2].pMethods)->xSync != 0)) {
    setPendingFd((unixFile *)id);
  }
  releaseInodeInfo((unixFile *)id);
  iVar1 = closeUnixFile(id);
  unixLeaveMutex();
  return iVar1;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  if( ALWAYS(pFile->pInode) && pFile->pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed 
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  releaseInodeInfo(pFile);
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}